

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepTiledOutputFile::copyPixels(DeepTiledOutputFile *this,DeepTiledInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  Data *pDVar3;
  pthread_mutex_t *ppVar4;
  bool bVar5;
  value_type_conflict *__val;
  Header *this_00;
  TileDescription *pTVar6;
  TileDescription *pTVar7;
  Box2i *pBVar8;
  Box2i *pBVar9;
  LineOrder *pLVar10;
  Compression *pCVar11;
  ChannelList *this_01;
  ChannelList *other;
  size_t sVar12;
  ArgExc *pAVar13;
  ostream *poVar14;
  LogicExc *this_02;
  LevelRoundingMode LVar15;
  size_type sVar16;
  ulong uVar17;
  char *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  TileCoord TVar23;
  int dx;
  vector<char,_std::allocator<char>_> data;
  int ly;
  int lx;
  int dy;
  uint64_t dataSize;
  vector<int,_std::allocator<int>_> ly_list;
  vector<int,_std::allocator<int>_> lx_list;
  vector<int,_std::allocator<int>_> dy_list;
  vector<int,_std::allocator<int>_> dx_list;
  int local_24c;
  vector<char,_std::allocator<char>_> local_248;
  int local_224;
  int local_220;
  int local_21c;
  ulong local_218;
  pthread_mutex_t *local_210;
  vector<int,_std::allocator<int>_> local_208;
  vector<int,_std::allocator<int>_> local_1f0;
  vector<int,_std::allocator<int>_> local_1d8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  pDVar3 = this->_data;
  this_00 = DeepTiledInputFile::header(in);
  pTVar6 = Header::tileDescription(&pDVar3->header);
  pTVar7 = Header::tileDescription(this_00);
  if ((((pTVar6->xSize != pTVar7->xSize) || (pTVar6->ySize != pTVar7->ySize)) ||
      (pTVar6->mode != pTVar7->mode)) ||
     (LVar15 = pTVar6->roundingMode, LVar15 != pTVar7->roundingMode)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar18 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar18 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files have different tile descriptions.",0x35);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pBVar8 = Header::dataWindow(&pDVar3->header);
  pBVar9 = Header::dataWindow(this_00);
  iVar21 = -(uint)((pBVar9->min).x == (pBVar8->min).x);
  iVar22 = -(uint)((pBVar9->min).y == (pBVar8->min).y);
  auVar19._4_4_ = iVar21;
  auVar19._0_4_ = iVar21;
  auVar19._8_4_ = iVar22;
  auVar19._12_4_ = iVar22;
  iVar21 = movmskpd(LVar15,auVar19);
  if ((iVar21 != 3) ||
     (iVar21 = -(uint)((pBVar9->max).x == (pBVar8->max).x),
     iVar22 = -(uint)((pBVar9->max).y == (pBVar8->max).y), auVar20._4_4_ = iVar21,
     auVar20._0_4_ = iVar21, auVar20._8_4_ = iVar22, auVar20._12_4_ = iVar22,
     iVar21 = movmskpd((int)pBVar9,auVar20), iVar21 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar18 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar18 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\". The files have different data windows.",0x29);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pLVar10 = Header::lineOrder(&pDVar3->header);
  LVar1 = *pLVar10;
  pLVar10 = Header::lineOrder(this_00);
  if (LVar1 != *pLVar10) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar18 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar18 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files have different line orders.",0x2f);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pCVar11 = Header::compression(&pDVar3->header);
  CVar2 = *pCVar11;
  pCVar11 = Header::compression(this_00);
  if (CVar2 == *pCVar11) {
    this_01 = Header::channels(&pDVar3->header);
    other = Header::channels(this_00);
    bVar5 = ChannelList::operator==(this_01,other);
    if (!bVar5) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
      pcVar18 = DeepTiledInputFile::fileName(in);
      poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
      pcVar18 = OStream::fileName(this->_data->_streamData->os);
      poVar14 = std::operator<<(poVar14,pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" failed.  The files have different channel lists.",0x32);
      pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
      __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    bVar5 = TileOffsets::isEmpty(&this->_data->tileOffsets);
    if (bVar5) {
      sVar12 = DeepTiledInputFile::totalTiles(in);
      ppVar4 = (pthread_mutex_t *)this->_data->_streamData;
      iVar21 = pthread_mutex_lock(ppVar4);
      if (iVar21 == 0) {
        sVar16 = 1;
        if (this->_data->lineOrder == RANDOM_Y) {
          sVar16 = sVar12;
        }
        local_210 = ppVar4;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_1b8,sVar16,
                   (allocator_type *)&local_1d8);
        sVar16 = 1;
        if (this->_data->lineOrder == RANDOM_Y) {
          sVar16 = sVar12;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1d8,sVar16,(allocator_type *)&local_1f0);
        sVar16 = 1;
        if (this->_data->lineOrder == RANDOM_Y) {
          sVar16 = sVar12;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1f0,sVar16,(allocator_type *)&local_208);
        sVar16 = 1;
        if (this->_data->lineOrder == RANDOM_Y) {
          sVar16 = sVar12;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_208,sVar16,(allocator_type *)&local_248);
        if (this->_data->lineOrder == RANDOM_Y) {
          DeepTiledInputFile::getTileOrder
                    (in,(int *)local_1b8._0_8_,
                     local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
          pDVar3 = this->_data;
          (pDVar3->nextTileToWrite).dx = *(int *)local_1b8._0_8_;
          (pDVar3->nextTileToWrite).dy =
               *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
          (pDVar3->nextTileToWrite).lx =
               *local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
          (pDVar3->nextTileToWrite).ly =
               *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
        }
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)operator_new(0x1000);
        pcVar18 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x1000;
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar18;
        memset(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0,0x1000);
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar18;
        if (sVar12 != 0) {
          local_1c0 = sVar12 - 1;
          uVar17 = 0;
          do {
            pDVar3 = this->_data;
            local_24c = (pDVar3->nextTileToWrite).dx;
            local_21c = (pDVar3->nextTileToWrite).dy;
            local_220 = (pDVar3->nextTileToWrite).lx;
            local_224 = (pDVar3->nextTileToWrite).ly;
            local_218 = (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start;
            DeepTiledInputFile::rawTileData
                      (in,&local_24c,&local_21c,&local_220,&local_224,
                       local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_218);
            if ((ulong)((long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < local_218) {
              std::vector<char,_std::allocator<char>_>::resize(&local_248,local_218);
              DeepTiledInputFile::rawTileData
                        (in,&local_24c,&local_21c,&local_220,&local_224,
                         local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&local_218);
            }
            anon_unknown_8::writeTileData
                      (this->_data,local_24c,local_21c,local_220,local_224,
                       local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       *(uint64_t *)
                        (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x10) + 0x28,
                       *(uint64_t *)
                        (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x18),
                       *(uint64_t *)
                        (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x20),
                       local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x28,
                       *(uint64_t *)
                        (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x10));
            pDVar3 = this->_data;
            if (pDVar3->lineOrder == RANDOM_Y) {
              if (uVar17 < local_1c0) {
                (pDVar3->nextTileToWrite).dx = *(int *)(local_1b8._0_8_ + (uVar17 + 1) * 4);
                (pDVar3->nextTileToWrite).dy =
                     local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17 + 1];
                (pDVar3->nextTileToWrite).lx =
                     local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17 + 1];
                (pDVar3->nextTileToWrite).ly =
                     local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17 + 1];
              }
            }
            else {
              TVar23 = Data::nextTileCoord(pDVar3,&pDVar3->nextTileToWrite);
              this->_data->nextTileToWrite = TVar23;
            }
            uVar17 = uVar17 + 1;
          } while (sVar12 != uVar17);
        }
        if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (char *)0x0) {
          operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        ppVar4 = local_210;
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((int *)local_1b8._0_8_ != (int *)0x0) {
          operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
        }
        pthread_mutex_unlock(ppVar4);
        return;
      }
      std::__throw_system_error(iVar21);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar18 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar18 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" failed. \"",0xb);
    pcVar18 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::LogicExc::LogicExc(this_02,(stringstream *)local_1b8);
    __cxa_throw(this_02,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
  pcVar18 = DeepTiledInputFile::fileName(in);
  poVar14 = std::operator<<((ostream *)&local_1a8,pcVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
  pcVar18 = OStream::fileName(this->_data->_streamData->os);
  poVar14 = std::operator<<(poVar14,pcVar18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"\" failed. The files use different compression methods.",0x36);
  pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
  __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::copyPixels (DeepTiledInputFile& in)
{

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    size_t numAllTiles = in.totalTiles ();

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // special handling for random tiles
    //

    vector<int> dx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> dy_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> lx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> ly_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);

    if (_data->lineOrder == RANDOM_Y)
    {
        in.getTileOrder (&dx_list[0], &dy_list[0], &lx_list[0], &ly_list[0]);
        _data->nextTileToWrite.dx = dx_list[0];
        _data->nextTileToWrite.dy = dy_list[0];
        _data->nextTileToWrite.lx = lx_list[0];
        _data->nextTileToWrite.ly = ly_list[0];
    }

    vector<char> data (4096);
    for (size_t i = 0; i < numAllTiles; ++i)
    {

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        uint64_t dataSize = data.size ();

        in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            data.resize (dataSize);
            in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        }
        uint64_t sampleCountTableSize  = *(uint64_t*) (&data[0] + 16);
        uint64_t pixelDataSize         = *(uint64_t*) (&data[0] + 24);
        uint64_t unpackedPixelDataSize = *(uint64_t*) (&data[0] + 32);
        char*    sampleCountTable      = &data[0] + 40;
        char*    pixelData = sampleCountTable + sampleCountTableSize;

        writeTileData (
            _data,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedPixelDataSize,
            sampleCountTable,
            sampleCountTableSize);

        if (_data->lineOrder == RANDOM_Y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_list[i + 1];
                _data->nextTileToWrite.dy = dy_list[i + 1];
                _data->nextTileToWrite.lx = lx_list[i + 1];
                _data->nextTileToWrite.ly = ly_list[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}